

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O3

bool __thiscall
DisasmReplayer::enqueue_create_descriptor_set_layout
          (DisasmReplayer *this,Hash hash,VkDescriptorSetLayoutCreateInfo *create_info,
          VkDescriptorSetLayout *layout)

{
  pointer *pppVVar1;
  pointer *pppVVar2;
  iterator __position;
  iterator __position_00;
  ulong extraout_RAX;
  VkDescriptorSetLayoutCreateInfo *local_20;
  
  local_20 = create_info;
  if (this->device == (VulkanDevice *)0x0) {
    *layout = (VkDescriptorSetLayout)hash;
  }
  else {
    enqueue_create_descriptor_set_layout();
    if ((extraout_RAX & 1) == 0) {
      return false;
    }
  }
  __position._M_current =
       (this->layouts).
       super__Vector_base<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->layouts).
      super__Vector_base<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkDescriptorSetLayout_T*,std::allocator<VkDescriptorSetLayout_T*>>::
    _M_realloc_insert<VkDescriptorSetLayout_T*const&>
              ((vector<VkDescriptorSetLayout_T*,std::allocator<VkDescriptorSetLayout_T*>> *)
               &this->layouts,__position,layout);
  }
  else {
    *__position._M_current = *layout;
    pppVVar2 = &(this->layouts).
                super__Vector_base<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppVVar2 = *pppVVar2 + 1;
  }
  __position_00._M_current =
       (this->set_layout_infos).
       super__Vector_base<const_VkDescriptorSetLayoutCreateInfo_*,_std::allocator<const_VkDescriptorSetLayoutCreateInfo_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->set_layout_infos).
      super__Vector_base<const_VkDescriptorSetLayoutCreateInfo_*,_std::allocator<const_VkDescriptorSetLayoutCreateInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<VkDescriptorSetLayoutCreateInfo_const*,std::allocator<VkDescriptorSetLayoutCreateInfo_const*>>
    ::_M_realloc_insert<VkDescriptorSetLayoutCreateInfo_const*const&>
              ((vector<VkDescriptorSetLayoutCreateInfo_const*,std::allocator<VkDescriptorSetLayoutCreateInfo_const*>>
                *)&this->set_layout_infos,__position_00,&local_20);
  }
  else {
    *__position_00._M_current = create_info;
    pppVVar1 = &(this->set_layout_infos).
                super__Vector_base<const_VkDescriptorSetLayoutCreateInfo_*,_std::allocator<const_VkDescriptorSetLayoutCreateInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  return true;
}

Assistant:

bool enqueue_create_descriptor_set_layout(Hash hash, const VkDescriptorSetLayoutCreateInfo *create_info, VkDescriptorSetLayout *layout) override
	{
		if (device)
		{
			LOGI("Creating descriptor set layout 0%" PRIX64 "\n", hash);
			if (vkCreateDescriptorSetLayout(device->get_device(), create_info, nullptr, layout) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*layout = fake_handle<VkDescriptorSetLayout>(hash);

		layouts.push_back(*layout);
		set_layout_infos.push_back(create_info);
		return true;
	}